

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O0

BoundFunction *
Js::BoundFunction::InflateBoundFunction
          (ScriptContext *ctx,RecyclableObject *function,Var bThis,uint32 ct,Type *args)

{
  Recycler *pRVar1;
  BoundFunction *this;
  JavascriptLibrary *this_00;
  DynamicType *type;
  TrackAllocData local_60;
  BoundFunction *local_38;
  BoundFunction *res;
  Type *args_local;
  Var pvStack_20;
  uint32 ct_local;
  Var bThis_local;
  RecyclableObject *function_local;
  ScriptContext *ctx_local;
  
  res = (BoundFunction *)args;
  args_local._4_4_ = ct;
  pvStack_20 = bThis;
  bThis_local = function;
  function_local = (RecyclableObject *)ctx;
  pRVar1 = ScriptContext::GetRecycler(ctx);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
             ,0x193);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_60);
  this = (BoundFunction *)new<Memory::Recycler>(0x50,pRVar1,0x43c4b0);
  this_00 = ScriptContext::GetLibrary((ScriptContext *)function_local);
  type = JavascriptLibrary::GetBoundFunctionType(this_00);
  BoundFunction(this,type);
  local_38 = this;
  Memory::WriteBarrierPtr<void>::operator=(&this->boundThis,pvStack_20);
  local_38->count = args_local._4_4_;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator=
            (&local_38->boundArgs,(WriteBarrierPtr<void> *)res);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::operator=
            (&local_38->targetFunction,(RecyclableObject *)bThis_local);
  return local_38;
}

Assistant:

BoundFunction* BoundFunction::InflateBoundFunction(
        ScriptContext* ctx, RecyclableObject* function, Var bThis, uint32 ct, Field(Var)* args)
    {
        BoundFunction* res = RecyclerNew(ctx->GetRecycler(), BoundFunction, ctx->GetLibrary()->GetBoundFunctionType());

        res->boundThis = bThis;
        res->count = ct;
        res->boundArgs = args;

        res->targetFunction = function;

        return res;
    }